

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileInstaller::ReportCopy(cmFileInstaller *this,char *toFile,Type type,bool copy)

{
  cmMakefile *this_00;
  char *message_00;
  char *local_90;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40 [8];
  string message;
  bool copy_local;
  Type type_local;
  char *toFile_local;
  cmFileInstaller *this_local;
  
  message.field_2._M_local_buf[0xb] = copy;
  message.field_2._12_4_ = type;
  if (((this->MessageNever & 1U) == 0) && ((copy || ((this->MessageLazy & 1U) == 0)))) {
    if (copy) {
      local_90 = "Installing: ";
    }
    else {
      local_90 = "Up-to-date: ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,local_90,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::__cxx11::string::operator+=(local_40,toFile);
    this_00 = (this->super_cmFileCopier).Makefile;
    message_00 = (char *)std::__cxx11::string::c_str();
    cmMakefile::DisplayStatus(this_00,message_00,-1.0);
    std::__cxx11::string::~string(local_40);
  }
  if (message.field_2._12_4_ != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,toFile,&local_79);
    ManifestAppend(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return;
}

Assistant:

void ReportCopy(const char* toFile, Type type, bool copy) CM_OVERRIDE
  {
    if (!this->MessageNever && (copy || !this->MessageLazy)) {
      std::string message = (copy ? "Installing: " : "Up-to-date: ");
      message += toFile;
      this->Makefile->DisplayStatus(message.c_str(), -1);
    }
    if (type != TypeDir) {
      // Add the file to the manifest.
      this->ManifestAppend(toFile);
    }
  }